

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glx_context.c
# Opt level: O0

GLXWindow glfwGetGLXWindow(GLFWwindow *handle)

{
  _GLFWwindow *window;
  GLFWwindow *handle_local;
  
  if (_glfw.initialized == 0) {
    _glfwInputError(0x10001,(char *)0x0);
    handle_local = (GLFWwindow *)0x0;
  }
  else if (*(int *)(handle + 0x204) == 0x36001) {
    handle_local = *(GLFWwindow **)(handle + 0x280);
  }
  else {
    _glfwInputError(0x1000a,(char *)0x0);
    handle_local = (GLFWwindow *)0x0;
  }
  return (GLXWindow)handle_local;
}

Assistant:

GLFWAPI GLXWindow glfwGetGLXWindow(GLFWwindow* handle)
{
    _GLFWwindow* window = (_GLFWwindow*) handle;
    _GLFW_REQUIRE_INIT_OR_RETURN(None);

    if (window->context.source != GLFW_NATIVE_CONTEXT_API)
    {
        _glfwInputError(GLFW_NO_WINDOW_CONTEXT, NULL);
        return None;
    }

    return window->context.glx.window;
}